

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O2

guint g_hash_table_lookup_node(GHashTable *hash_table,gconstpointer key)

{
  guint gVar1;
  gboolean gVar2;
  GHashNode *pGVar3;
  GHashNode *pGVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  gVar1 = (*hash_table->hash_func)(key);
  uVar5 = 2;
  if (2 < gVar1) {
    uVar5 = (ulong)gVar1;
  }
  uVar7 = uVar5 % (ulong)(uint)hash_table->mod;
  pGVar3 = hash_table->nodes;
  pGVar4 = pGVar3 + uVar7;
  iVar6 = 1;
  do {
    gVar1 = (guint)uVar7;
    if (pGVar4->key_hash == 0) {
      return gVar1;
    }
    if (pGVar4->key_hash == (guint)uVar5) {
      if (hash_table->key_equal_func == (GEqualFunc)0x0) {
        if (pGVar4->key == key) {
          return gVar1;
        }
      }
      else {
        gVar2 = (*hash_table->key_equal_func)(pGVar4->key,key);
        if (gVar2 != 0) {
          return gVar1;
        }
        pGVar3 = hash_table->nodes;
      }
    }
    uVar7 = (ulong)(gVar1 + iVar6 & hash_table->mask);
    pGVar4 = pGVar3 + uVar7;
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

static inline guint g_hash_table_lookup_node (GHashTable    *hash_table,
        gconstpointer  key)
{
    GHashNode *node;
    guint node_index;
    guint hash_value;
    guint step = 0;

    /* Empty buckets have hash_value set to 0, and for tombstones, it's 1.
     * We need to make sure our hash value is not one of these. */

    hash_value = (* hash_table->hash_func) (key);
    if (hash_value <= 1)
        hash_value = 2;

    node_index = hash_value % hash_table->mod;
    node = &hash_table->nodes [node_index];

    while (node->key_hash)
    {
        /*  We first check if our full hash values
         *  are equal so we can avoid calling the full-blown
         *  key equality function in most cases.
         */

        if (node->key_hash == hash_value)
        {
            if (hash_table->key_equal_func)
            {
                if (hash_table->key_equal_func (node->key, key))
                    break;
            }
            else if (node->key == key)
            {
                break;
            }
        }

        step++;
        node_index += step;
        node_index &= hash_table->mask;
        node = &hash_table->nodes [node_index];
    }

    return node_index;
}